

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O2

optional<QByteArray> *
qEnvironmentVariableOptionalByteArray(optional<QByteArray> *__return_storage_ptr__,char *name)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_38);
  if (local_38.ptr == (char *)0x0) {
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_engaged = false;
  }
  else {
    std::_Optional_payload_base<QByteArray>::_Optional_payload_base<QByteArray>
              ((_Optional_payload_base<QByteArray> *)__return_storage_ptr__,&local_38);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QByteArray> qEnvironmentVariableOptionalByteArray(const char *name)
{
    QByteArray value = qgetenv(name);
    return value.isNull() ? std::nullopt : std::optional(std::move(value));
}